

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O2

boolean clear_fcorr(monst *grd,boolean forceshow)

{
  char cVar1;
  char cVar2;
  monst *mtmp;
  long lVar3;
  xchar xVar4;
  xchar xVar5;
  boolean bVar6;
  int iVar7;
  int y;
  int y_00;
  level *lev;
  int x;
  int x_00;
  
  bVar6 = on_level((d_level *)((long)&grd[1].data + 4),&u.uz);
  if (bVar6 != '\0') {
    iVar7 = *(int *)&grd->field_0x74;
    while (xVar5 = u.uy, xVar4 = u.ux, iVar7 < *(int *)&grd[1].nmon) {
      lVar3 = (long)iVar7 * 3;
      cVar1 = *(char *)((long)grd[1].mtrack + lVar3 + -0x34);
      x_00 = (int)cVar1;
      cVar2 = *(char *)((long)grd[1].mtrack + lVar3 + -0x33);
      y = (int)cVar2;
      iVar7 = grd->mhp;
      x = (int)u.ux;
      y_00 = (int)u.uy;
      if (((iVar7 < 1) || (bVar6 = in_fcorridor(grd,x,y_00), bVar6 == '\0')) &&
         (((ulong)grd[1].data & 0x100000000000000) != 0)) {
        forceshow = '\x01';
      }
      lev = level;
      if (((((0 < iVar7) && (xVar4 == cVar1)) && (xVar5 == cVar2)) ||
          ((forceshow == '\0' && ((viz_array[y][x_00] & 1U) != 0)))) ||
         ((uball != (obj *)0x0 &&
          (((uball->where != '\x03' && (uball->ox == cVar1)) && (uball->oy == cVar2)))))) {
        return '\0';
      }
      mtmp = level->monsters[x_00][y];
      if ((mtmp != (monst *)0x0) && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) {
        if ((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) != 0) {
          return '\0';
        }
        bVar6 = in_fcorridor(grd,x,y_00);
        if (bVar6 == '\0') {
          if (mtmp->mtame != '\0') {
            yelp(mtmp);
            lev = level;
          }
          rloc(lev,mtmp,'\0');
          lev = level;
        }
      }
      lev->locations[x_00][y].typ = *(schar *)((long)grd[1].mtrack + lVar3 + -0x32);
      map_location(x_00,y,1);
      if (level->locations[x_00][y].typ < '\x17') {
        block_point(x_00,y);
      }
      iVar7 = *(int *)&grd->field_0x74 + 1;
      *(int *)&grd->field_0x74 = iVar7;
    }
    if ((grd->mhp < 1) &&
       (pline("The corridor disappears."), level->locations[u.ux][u.uy].typ < '\x11')) {
      pline("You are encased in rock.");
    }
  }
  return '\x01';
}

Assistant:

static boolean clear_fcorr(struct monst *grd, boolean forceshow)
{
	int fcx, fcy, fcbeg;
	struct monst *mtmp;

	if (!on_level(&(EGD(grd)->gdlevel), &u.uz)) return TRUE;

	while ((fcbeg = EGD(grd)->fcbeg) < EGD(grd)->fcend) {
		fcx = EGD(grd)->fakecorr[fcbeg].fx;
		fcy = EGD(grd)->fakecorr[fcbeg].fy;
		if ((grd->mhp <= 0 || !in_fcorridor(grd, u.ux, u.uy)) &&
				   EGD(grd)->gddone)
			forceshow = TRUE;
		if ((u.ux == fcx && u.uy == fcy && grd->mhp > 0)
			|| (!forceshow && couldsee(fcx,fcy))
			|| (Punished && !carried(uball)
				&& uball->ox == fcx && uball->oy == fcy))
			return FALSE;

		if ((mtmp = m_at(level, fcx,fcy)) != 0) {
			if (mtmp->isgd) return FALSE;
			else if (!in_fcorridor(grd, u.ux, u.uy)) {
			    if (mtmp->mtame) yelp(mtmp);
			    rloc(level, mtmp, FALSE);
			}
		}
		level->locations[fcx][fcy].typ = EGD(grd)->fakecorr[fcbeg].ftyp;
		map_location(fcx, fcy, 1);	/* bypass vision */
		if (!ACCESSIBLE(level->locations[fcx][fcy].typ)) block_point(fcx,fcy);
		EGD(grd)->fcbeg++;
	}
	if (grd->mhp <= 0) {
	    pline("The corridor disappears.");
	    if (IS_ROCK(level->locations[u.ux][u.uy].typ)) pline("You are encased in rock.");
	}
	return TRUE;
}